

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step3(connectdata *conn,int sockindex)

{
  byte bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  _Bool local_59;
  void *local_48;
  void *old_ssl_sessionid;
  SSL_SESSION *our_ssl_sessionid;
  ssl_connect_data *psStack_30;
  _Bool incache;
  ssl_connect_data *connssl;
  Curl_easy *data;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  data._0_4_ = 0;
  connssl = (ssl_connect_data *)conn->data;
  psStack_30 = conn->ssl + sockindex;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (((Curl_easy *)connssl)->set).proxy_ssl.primary.sessionid;
  }
  else {
    bVar1 = (((Curl_easy *)connssl)->set).ssl.primary.sessionid;
  }
  data._4_4_ = sockindex;
  _result = conn;
  if ((bVar1 & 1) != 0) {
    local_48 = (void *)0x0;
    old_ssl_sessionid = SSL_get1_session((SSL *)psStack_30->backend->handle);
    Curl_ssl_sessionid_lock(_result);
    _Var2 = Curl_ssl_getsessionid(_result,&local_48,(size_t *)0x0,data._4_4_);
    our_ssl_sessionid._7_1_ = (_Var2 ^ 0xffU) & 1;
    if ((our_ssl_sessionid._7_1_ != 0) && (local_48 != old_ssl_sessionid)) {
      Curl_infof((Curl_easy *)connssl,"old SSL session ID is stale, removing\n");
      Curl_ssl_delsessionid(_result,local_48);
      our_ssl_sessionid._7_1_ = 0;
    }
    if (our_ssl_sessionid._7_1_ == 0) {
      data._0_4_ = Curl_ssl_addsessionid(_result,old_ssl_sessionid,0,data._4_4_);
      if ((CURLcode)data != CURLE_OK) {
        Curl_ssl_sessionid_unlock(_result);
        Curl_failf((Curl_easy *)connssl,"failed to store ssl session");
        return (CURLcode)data;
      }
      data._0_4_ = 0;
    }
    else {
      SSL_SESSION_free((SSL_SESSION *)old_ssl_sessionid);
    }
    Curl_ssl_sessionid_unlock(_result);
  }
  if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (_result->proxy_ssl_config).verifypeer;
  }
  else {
    bVar1 = (_result->ssl_config).verifypeer;
  }
  local_59 = true;
  if ((bVar1 & 1) == 0) {
    if (((_result->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      bVar1 = (_result->proxy_ssl_config).verifyhost;
    }
    else {
      bVar1 = (_result->ssl_config).verifyhost;
    }
    local_59 = (bVar1 & 1) != 0;
  }
  CVar3 = servercert(_result,psStack_30,local_59);
  if (CVar3 == CURLE_OK) {
    psStack_30->connecting_state = ssl_connect_done;
  }
  return CVar3;
}

Assistant:

static CURLcode ossl_connect_step3(struct connectdata *conn, int sockindex)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];

  DEBUGASSERT(ssl_connect_3 == connssl->connecting_state);

  if(SSL_SET_OPTION(primary.sessionid)) {
    bool incache;
    SSL_SESSION *our_ssl_sessionid;
    void *old_ssl_sessionid = NULL;

    our_ssl_sessionid = SSL_get1_session(BACKEND->handle);

    /* SSL_get1_session() will increment the reference count and the session
        will stay in memory until explicitly freed with SSL_SESSION_free(3),
        regardless of its state. */

    Curl_ssl_sessionid_lock(conn);
    incache = !(Curl_ssl_getsessionid(conn, &old_ssl_sessionid, NULL,
                                      sockindex));
    if(incache) {
      if(old_ssl_sessionid != our_ssl_sessionid) {
        infof(data, "old SSL session ID is stale, removing\n");
        Curl_ssl_delsessionid(conn, old_ssl_sessionid);
        incache = FALSE;
      }
    }

    if(!incache) {
      result = Curl_ssl_addsessionid(conn, our_ssl_sessionid,
                                      0 /* unknown size */, sockindex);
      if(result) {
        Curl_ssl_sessionid_unlock(conn);
        failf(data, "failed to store ssl session");
        return result;
      }
    }
    else {
      /* Session was incache, so refcount already incremented earlier.
        * Avoid further increments with each SSL_get1_session() call.
        * This does not free the session as refcount remains > 0
        */
      SSL_SESSION_free(our_ssl_sessionid);
    }
    Curl_ssl_sessionid_unlock(conn);
  }

  /*
   * We check certificates to authenticate the server; otherwise we risk
   * man-in-the-middle attack; NEVERTHELESS, if we're told explicitly not to
   * verify the peer ignore faults and failures from the server cert
   * operations.
   */

  result = servercert(conn, connssl, (SSL_CONN_CONFIG(verifypeer) ||
                                      SSL_CONN_CONFIG(verifyhost)));

  if(!result)
    connssl->connecting_state = ssl_connect_done;

  return result;
}